

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

LiteralSelector * __thiscall
Saturation::SaturationAlgorithm::getSosLiteralSelector(SaturationAlgorithm *this)

{
  Sos SVar1;
  Options *pOVar2;
  LiteralSelector *pLVar3;
  
  pOVar2 = (this->super_MainLoop)._opt;
  SVar1 = (pOVar2->_sos).super_OptionValue<Shell::Options::Sos>.actualValue;
  if ((SVar1 == THEORY) || (SVar1 == ALL)) {
    pLVar3 = (this->_sosLiteralSelector)._obj;
    if (pLVar3 == (LiteralSelector *)0x0) {
      pLVar3 = (LiteralSelector *)::operator_new(0x20);
      pLVar3->_ord = (this->_ordering)._obj;
      pLVar3->_opt = pOVar2;
      pLVar3->_reversePolarity = false;
      pLVar3->_vptr_LiteralSelector = (_func_int **)&PTR__LiteralSelector_009fe300;
      (this->_sosLiteralSelector)._obj = pLVar3;
    }
  }
  else {
    pLVar3 = (this->_selector)._obj;
  }
  return pLVar3;
}

Assistant:

LiteralSelector& SaturationAlgorithm::getSosLiteralSelector()
{
  if (_opt.sos() == Options::Sos::ALL || _opt.sos() == Options::Sos::THEORY) {
    if (!_sosLiteralSelector) {
      _sosLiteralSelector = new TotalLiteralSelector(getOrdering(), getOptions());
    }
    return *_sosLiteralSelector;
  }
  else {
    return *_selector;
  }
}